

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall Image::saveToPPM(Image *this,char *filename)

{
  ostream *poVar1;
  int j;
  int iVar2;
  int i;
  int iVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs);
  std::ofstream::open((char *)&ofs,(_Ios_Openmode)filename);
  poVar1 = std::operator<<((ostream *)&ofs,"P6\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->width);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::operator<<(poVar1,"\n255\n");
  pfVar4 = this->imageData;
  for (iVar2 = 0; iVar2 < this->height; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; iVar3 < this->width; iVar3 = iVar3 + 1) {
      fVar5 = powf(*pfVar4,0.45454547);
      fVar5 = fVar5 * 255.0 + 0.5;
      if (255.0 <= fVar5) {
        fVar5 = 255.0;
      }
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar6 = powf(pfVar4[1],0.45454547);
      fVar7 = powf(pfVar4[2],0.45454547);
      poVar1 = std::operator<<((ostream *)&ofs,(char)(int)fVar5);
      fVar5 = fVar6 * 255.0 + 0.5;
      if (255.0 <= fVar5) {
        fVar5 = 255.0;
      }
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      poVar1 = std::operator<<(poVar1,(char)(int)fVar5);
      fVar5 = fVar7 * 255.0 + 0.5;
      if (255.0 <= fVar5) {
        fVar5 = 255.0;
      }
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      std::operator<<(poVar1,(char)(int)fVar5);
      pfVar4 = pfVar4 + 3;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void Image::saveToPPM(const char *filename) {
    std::ofstream ofs;
        ofs.open(filename);
        ofs << "P6\n" << width << " " << height << "\n255\n";
        float *pixel = imageData;
        for (int j = 0; j < height; ++j) {
            for (int i = 0; i < width; ++i) {
                unsigned char r = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[0], 1/2.2) * 255 + 0.5f)));
                unsigned char g = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[1], 1/2.2) * 255 + 0.5f)));
                unsigned char b = (unsigned char)(std::max(0.f, std::min(255.f, powf(pixel[2], 1/2.2) * 255 + 0.5f)));
                ofs << r << g << b;
                pixel += 3;
            }
        }
        ofs.close();
}